

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  parasail_result_t *ppVar12;
  __m128i *palVar13;
  __m128i *ptr;
  __m128i *ptr_00;
  int32_t *ptr_01;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  int32_t iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  ulong size;
  __m128i *ptr_02;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  int iVar43;
  int iVar47;
  int iVar48;
  int iVar49;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar50;
  int iVar52;
  uint uVar53;
  undefined1 auVar51 [16];
  uint uVar54;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  undefined1 auVar55 [16];
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  __m128i_32_t e;
  __m128i_32_t h;
  int local_e0;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse41_128_32_cold_4();
        }
        else {
          uVar19 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_striped_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_striped_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_striped_profile_sse41_128_32_cold_1();
          }
          else {
            iVar8 = uVar3 - 1;
            uVar42 = (ulong)uVar3 + 3;
            size = uVar42 >> 2;
            uVar29 = (uint)size;
            iVar9 = iVar8 / (int)uVar29;
            uVar15 = iVar8 % (int)uVar29;
            iVar18 = -open;
            iVar20 = ppVar6->min;
            uVar27 = 0x80000000 - iVar20;
            if (iVar20 != iVar18 && SBORROW4(iVar20,iVar18) == iVar20 + open < 0) {
              uVar27 = open | 0x80000000;
            }
            uVar10 = 0x7ffffffe - ppVar6->max;
            ppVar12 = parasail_result_new_table1((uint)uVar42 & 0x7ffffffc,s2Len);
            if (ppVar12 != (parasail_result_t *)0x0) {
              ppVar12->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar12->flag | 0x4420802;
              palVar13 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              uVar14 = 0;
              if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (ptr != (__m128i *)0x0 && palVar13 != (__m128i *)0x0)) {
                iVar11 = s2Len + -1;
                iVar16 = 3 - iVar9;
                uVar27 = uVar27 + 1;
                auVar33._4_4_ = uVar27;
                auVar33._0_4_ = uVar27;
                auVar33._8_4_ = uVar27;
                auVar33._12_4_ = uVar27;
                iVar20 = iVar18;
                do {
                  lVar22 = 0;
                  iVar21 = iVar20;
                  do {
                    iVar52 = 0;
                    if (s1_beg == 0) {
                      iVar52 = iVar21;
                    }
                    *(int *)((long)&local_48 + lVar22 * 4) = iVar52;
                    lVar23 = (long)iVar52 - (ulong)(uint)open;
                    if (lVar23 < -0x7fffffff) {
                      lVar23 = -0x80000000;
                    }
                    *(int *)((long)&local_58 + lVar22 * 4) = (int)lVar23;
                    lVar22 = lVar22 + 1;
                    iVar21 = iVar21 - gap * uVar29;
                  } while (lVar22 != 4);
                  palVar13[uVar14][0] = local_48;
                  palVar13[uVar14][1] = lStack_40;
                  ptr_00[uVar14][0] = local_58;
                  ptr_00[uVar14][1] = lStack_50;
                  uVar14 = uVar14 + 1;
                  iVar20 = iVar20 - gap;
                } while (uVar14 != size);
                *ptr_01 = 0;
                uVar14 = 1;
                iVar20 = iVar18;
                do {
                  iVar17 = 0;
                  if (s2_beg == 0) {
                    iVar17 = iVar20;
                  }
                  ptr_01[uVar14] = iVar17;
                  uVar14 = uVar14 + 1;
                  iVar20 = iVar20 - gap;
                } while (s2Len + 1 != uVar14);
                uVar14 = 1;
                if (1 < s2Len) {
                  uVar14 = uVar19;
                }
                lVar23 = size * uVar19;
                lVar24 = (ulong)(uVar29 + (uVar29 == 0)) << 4;
                lVar22 = 0;
                uVar26 = 0;
                auVar35 = auVar33;
                auVar45 = auVar33;
                uVar38 = uVar10;
                uVar39 = uVar10;
                uVar40 = uVar10;
                uVar41 = uVar10;
                local_e0 = iVar11;
                do {
                  ptr_02 = ptr;
                  ptr = palVar13;
                  iVar4 = ppVar6->mapper[(byte)s2[uVar26]];
                  palVar13 = ptr + (uVar29 - 1);
                  iVar20 = (int)(*palVar13)[0];
                  iVar21 = *(int *)((long)*palVar13 + 4);
                  iVar52 = (int)(*palVar13)[1];
                  iVar17 = ptr_01[uVar26];
                  lVar25 = 0;
                  lVar30 = lVar22;
                  auVar36 = auVar35;
                  auVar44 = auVar33;
                  do {
                    piVar1 = (int *)((long)pvVar5 + lVar25 + size * (long)iVar4 * 0x10);
                    iVar50 = iVar17 + *piVar1;
                    iVar20 = iVar20 + piVar1[1];
                    iVar21 = iVar21 + piVar1[2];
                    iVar52 = iVar52 + piVar1[3];
                    piVar1 = (int *)((long)*ptr_00 + lVar25);
                    iVar59 = *piVar1;
                    iVar60 = piVar1[1];
                    iVar61 = piVar1[2];
                    iVar62 = piVar1[3];
                    iVar43 = auVar44._0_4_;
                    uVar54 = (uint)(iVar59 < iVar43) * iVar43 | (uint)(iVar59 >= iVar43) * iVar59;
                    iVar47 = auVar44._4_4_;
                    uVar56 = (uint)(iVar60 < iVar47) * iVar47 | (uint)(iVar60 >= iVar47) * iVar60;
                    iVar48 = auVar44._8_4_;
                    uVar57 = (uint)(iVar61 < iVar48) * iVar48 | (uint)(iVar61 >= iVar48) * iVar61;
                    iVar49 = auVar44._12_4_;
                    uVar58 = (uint)(iVar62 < iVar49) * iVar49 | (uint)(iVar62 >= iVar49) * iVar62;
                    uVar54 = (uint)((int)uVar54 < iVar50) * iVar50 |
                             ((int)uVar54 >= iVar50) * uVar54;
                    uVar56 = (uint)((int)uVar56 < iVar20) * iVar20 |
                             ((int)uVar56 >= iVar20) * uVar56;
                    uVar57 = (uint)((int)uVar57 < iVar21) * iVar21 |
                             ((int)uVar57 >= iVar21) * uVar57;
                    uVar58 = (uint)((int)uVar58 < iVar52) * iVar52 |
                             ((int)uVar58 >= iVar52) * uVar58;
                    puVar2 = (uint *)((long)*ptr_02 + lVar25);
                    *puVar2 = uVar54;
                    puVar2[1] = uVar56;
                    puVar2[2] = uVar57;
                    puVar2[3] = uVar58;
                    iVar20 = auVar36._0_4_;
                    auVar35._0_4_ =
                         (iVar20 < (int)uVar54) * uVar54 | (uint)(iVar20 >= (int)uVar54) * iVar20;
                    iVar20 = auVar36._4_4_;
                    auVar35._4_4_ =
                         (iVar20 < (int)uVar56) * uVar56 | (uint)(iVar20 >= (int)uVar56) * iVar20;
                    iVar20 = auVar36._8_4_;
                    iVar21 = auVar36._12_4_;
                    auVar35._8_4_ =
                         (iVar20 < (int)uVar57) * uVar57 | (uint)(iVar20 >= (int)uVar57) * iVar20;
                    auVar35._12_4_ =
                         (iVar21 < (int)uVar58) * uVar58 | (uint)(iVar21 >= (int)uVar58) * iVar21;
                    uVar38 = (uint)(iVar59 < (int)uVar38) * iVar59 |
                             (iVar59 >= (int)uVar38) * uVar38;
                    uVar39 = (uint)(iVar60 < (int)uVar39) * iVar60 |
                             (iVar60 >= (int)uVar39) * uVar39;
                    uVar40 = (uint)(iVar61 < (int)uVar40) * iVar61 |
                             (iVar61 >= (int)uVar40) * uVar40;
                    uVar41 = (uint)(iVar62 < (int)uVar41) * iVar62 |
                             (iVar62 >= (int)uVar41) * uVar41;
                    piVar1 = ((ppVar12->field_4).rowcols)->score_row;
                    *(uint *)((long)piVar1 + lVar30) = uVar54;
                    *(uint *)((long)piVar1 + lVar23 * 4 + lVar30) = uVar56;
                    *(uint *)((long)piVar1 + lVar23 * 8 + lVar30) = uVar57;
                    *(uint *)((long)piVar1 + lVar23 * 0xc + lVar30) = uVar58;
                    uVar38 = (uint)(iVar43 < (int)uVar38) * iVar43 |
                             (iVar43 >= (int)uVar38) * uVar38;
                    uVar39 = (uint)(iVar47 < (int)uVar39) * iVar47 |
                             (iVar47 >= (int)uVar39) * uVar39;
                    uVar40 = (uint)(iVar48 < (int)uVar40) * iVar48 |
                             (iVar48 >= (int)uVar40) * uVar40;
                    uVar41 = (uint)(iVar49 < (int)uVar41) * iVar49 |
                             (iVar49 >= (int)uVar41) * uVar41;
                    uVar38 = ((int)uVar54 < (int)uVar38) * uVar54 |
                             ((int)uVar54 >= (int)uVar38) * uVar38;
                    uVar39 = ((int)uVar56 < (int)uVar39) * uVar56 |
                             ((int)uVar56 >= (int)uVar39) * uVar39;
                    uVar40 = ((int)uVar57 < (int)uVar40) * uVar57 |
                             ((int)uVar57 >= (int)uVar40) * uVar40;
                    uVar41 = ((int)uVar58 < (int)uVar41) * uVar58 |
                             ((int)uVar58 >= (int)uVar41) * uVar41;
                    iVar20 = uVar54 - open;
                    iVar21 = uVar56 - open;
                    iVar52 = uVar57 - open;
                    iVar50 = uVar58 - open;
                    iVar59 = iVar59 - gap;
                    iVar60 = iVar60 - gap;
                    iVar61 = iVar61 - gap;
                    iVar62 = iVar62 - gap;
                    puVar2 = (uint *)((long)*ptr_00 + lVar25);
                    *puVar2 = (uint)(iVar59 < iVar20) * iVar20 | (uint)(iVar59 >= iVar20) * iVar59;
                    puVar2[1] = (uint)(iVar60 < iVar21) * iVar21 | (uint)(iVar60 >= iVar21) * iVar60
                    ;
                    puVar2[2] = (uint)(iVar61 < iVar52) * iVar52 | (uint)(iVar61 >= iVar52) * iVar61
                    ;
                    puVar2[3] = (uint)(iVar62 < iVar50) * iVar50 | (uint)(iVar62 >= iVar50) * iVar62
                    ;
                    iVar43 = iVar43 - gap;
                    iVar47 = iVar47 - gap;
                    iVar48 = iVar48 - gap;
                    iVar49 = iVar49 - gap;
                    auVar44._0_4_ =
                         (uint)(iVar43 < iVar20) * iVar20 | (uint)(iVar43 >= iVar20) * iVar43;
                    auVar44._4_4_ =
                         (uint)(iVar47 < iVar21) * iVar21 | (uint)(iVar47 >= iVar21) * iVar47;
                    auVar44._8_4_ =
                         (uint)(iVar48 < iVar52) * iVar52 | (uint)(iVar48 >= iVar52) * iVar48;
                    auVar44._12_4_ =
                         (uint)(iVar49 < iVar50) * iVar50 | (uint)(iVar49 >= iVar50) * iVar49;
                    piVar1 = (int *)((long)*ptr + lVar25);
                    iVar17 = *piVar1;
                    iVar20 = piVar1[1];
                    iVar21 = piVar1[2];
                    iVar52 = piVar1[3];
                    lVar25 = lVar25 + 0x10;
                    lVar30 = lVar30 + uVar19 * 4;
                    auVar36 = auVar35;
                  } while (lVar24 != lVar25);
                  uVar54 = 0;
                  do {
                    iVar20 = iVar18;
                    if (s2_beg == 0) {
                      iVar20 = ptr_01[uVar26 + 1] - open;
                    }
                    auVar36._0_4_ = auVar44._0_4_;
                    auVar36._4_4_ = auVar36._0_4_;
                    auVar36._8_4_ = auVar44._4_4_;
                    auVar36._12_4_ = auVar44._8_4_;
                    auVar44._4_4_ = auVar36._0_4_;
                    auVar44._0_4_ = iVar20;
                    auVar44._8_8_ = auVar36._8_8_;
                    bVar32 = true;
                    uVar31 = 1;
                    lVar25 = 0;
                    lVar30 = lVar22;
                    auVar36 = auVar35;
                    do {
                      piVar1 = (int *)((long)*ptr_02 + lVar25);
                      iVar21 = *piVar1;
                      iVar52 = piVar1[1];
                      iVar4 = piVar1[2];
                      iVar43 = piVar1[3];
                      iVar20 = auVar44._0_4_;
                      uVar56 = (uint)(iVar21 < iVar20) * iVar20 | (uint)(iVar21 >= iVar20) * iVar21;
                      iVar21 = auVar44._4_4_;
                      uVar57 = (uint)(iVar52 < iVar21) * iVar21 | (uint)(iVar52 >= iVar21) * iVar52;
                      iVar52 = auVar44._8_4_;
                      uVar58 = (uint)(iVar4 < iVar52) * iVar52 | (uint)(iVar4 >= iVar52) * iVar4;
                      iVar4 = auVar44._12_4_;
                      uVar53 = (uint)(iVar43 < iVar4) * iVar4 | (uint)(iVar43 >= iVar4) * iVar43;
                      puVar2 = (uint *)((long)*ptr_02 + lVar25);
                      *puVar2 = uVar56;
                      puVar2[1] = uVar57;
                      puVar2[2] = uVar58;
                      puVar2[3] = uVar53;
                      piVar1 = ((ppVar12->field_4).rowcols)->score_row;
                      *(uint *)((long)piVar1 + lVar30) = uVar56;
                      lVar28 = (long)piVar1 + lVar30;
                      *(uint *)(lVar23 * 4 + lVar28) = uVar57;
                      *(uint *)(lVar23 * 8 + lVar28) = uVar58;
                      *(uint *)(lVar23 * 0xc + lVar28) = uVar53;
                      uVar38 = ((int)uVar56 < (int)uVar38) * uVar56 |
                               ((int)uVar56 >= (int)uVar38) * uVar38;
                      uVar39 = ((int)uVar57 < (int)uVar39) * uVar57 |
                               ((int)uVar57 >= (int)uVar39) * uVar39;
                      uVar40 = ((int)uVar58 < (int)uVar40) * uVar58 |
                               ((int)uVar58 >= (int)uVar40) * uVar40;
                      uVar41 = ((int)uVar53 < (int)uVar41) * uVar53 |
                               ((int)uVar53 >= (int)uVar41) * uVar41;
                      iVar43 = auVar36._0_4_;
                      auVar35._0_4_ =
                           (iVar43 < (int)uVar56) * uVar56 | (uint)(iVar43 >= (int)uVar56) * iVar43;
                      iVar43 = auVar36._4_4_;
                      auVar35._4_4_ =
                           (iVar43 < (int)uVar57) * uVar57 | (uint)(iVar43 >= (int)uVar57) * iVar43;
                      iVar43 = auVar36._8_4_;
                      iVar47 = auVar36._12_4_;
                      auVar35._8_4_ =
                           (iVar43 < (int)uVar58) * uVar58 | (uint)(iVar43 >= (int)uVar58) * iVar43;
                      auVar35._12_4_ =
                           (iVar47 < (int)uVar53) * uVar53 | (uint)(iVar47 >= (int)uVar53) * iVar47;
                      auVar44._0_4_ = iVar20 - gap;
                      auVar44._4_4_ = iVar21 - gap;
                      auVar44._8_4_ = iVar52 - gap;
                      auVar44._12_4_ = iVar4 - gap;
                      auVar55._0_4_ = -(uint)((int)(uVar56 - open) < (int)auVar44._0_4_);
                      auVar55._4_4_ = -(uint)((int)(uVar57 - open) < (int)auVar44._4_4_);
                      auVar55._8_4_ = -(uint)((int)(uVar58 - open) < (int)auVar44._8_4_);
                      auVar55._12_4_ = -(uint)((int)(uVar53 - open) < (int)auVar44._12_4_);
                      iVar20 = movmskps((int)lVar28,auVar55);
                      if (iVar20 == 0) break;
                      bVar32 = uVar31 < size;
                      lVar25 = lVar25 + 0x10;
                      lVar30 = lVar30 + uVar19 * 4;
                      uVar31 = uVar31 + 1;
                      auVar36 = auVar35;
                    } while (lVar24 != lVar25);
                  } while ((!bVar32) && (bVar32 = uVar54 < 3, uVar54 = uVar54 + 1, bVar32));
                  palVar13 = ptr_02 + uVar15;
                  iVar20 = (int)(*palVar13)[0];
                  iVar21 = *(int *)((long)*palVar13 + 4);
                  iVar52 = (int)(*palVar13)[1];
                  iVar4 = *(int *)((long)*palVar13 + 0xc);
                  iVar43 = auVar45._0_4_;
                  auVar51._0_4_ = -(uint)(iVar43 < iVar20);
                  iVar47 = auVar45._4_4_;
                  auVar51._4_4_ = -(uint)(iVar47 < iVar21);
                  iVar48 = auVar45._8_4_;
                  auVar51._8_4_ = -(uint)(iVar48 < iVar52);
                  iVar49 = auVar45._12_4_;
                  auVar51._12_4_ = -(uint)(iVar49 < iVar4);
                  auVar7._4_4_ = -(uint)(iVar16 == 2);
                  auVar7._0_4_ = -(uint)(iVar16 == 3);
                  auVar7._8_4_ = -(uint)(iVar16 == 1);
                  auVar7._12_4_ = -(uint)(iVar16 == 0);
                  auVar45._0_4_ =
                       (uint)(iVar20 < iVar43) * iVar43 | (uint)(iVar20 >= iVar43) * iVar20;
                  auVar45._4_4_ =
                       (uint)(iVar21 < iVar47) * iVar47 | (uint)(iVar21 >= iVar47) * iVar21;
                  auVar45._8_4_ =
                       (uint)(iVar52 < iVar48) * iVar48 | (uint)(iVar52 >= iVar48) * iVar52;
                  auVar45._12_4_ = (uint)(iVar4 < iVar49) * iVar49 | (uint)(iVar4 >= iVar49) * iVar4
                  ;
                  iVar20 = movmskps(uVar15 * 0x10,auVar51 & auVar7);
                  if (iVar20 != 0) {
                    local_e0 = (int)uVar26;
                  }
                  uVar26 = uVar26 + 1;
                  lVar22 = lVar22 + 4;
                  palVar13 = ptr_02;
                  if (uVar26 == uVar14) {
                    uVar54 = uVar27;
                    if ((s2_end != 0) && (uVar54 = auVar45._12_4_, iVar9 < 3)) {
                      iVar20 = 1;
                      if (1 < iVar16) {
                        iVar20 = iVar16;
                      }
                      do {
                        auVar46._0_8_ = auVar45._0_8_ << 0x20;
                        auVar46._8_8_ = auVar45._8_8_ << 0x20 | auVar45._0_8_ >> 0x20;
                        uVar54 = auVar45._8_4_;
                        iVar20 = iVar20 + -1;
                        auVar45 = auVar46;
                      } while (iVar20 != 0);
                    }
                    iVar20 = iVar8;
                    if ((s1_end != 0) && ((uVar42 & 0x7ffffffc) != 0)) {
                      uVar19 = 0;
                      do {
                        iVar18 = ((uint)uVar19 & 3) * uVar29 + ((uint)(uVar19 >> 2) & 0x3fffffff);
                        uVar56 = uVar54;
                        iVar21 = local_e0;
                        iVar52 = iVar20;
                        if ((iVar18 < (int)uVar3) &&
                           (uVar57 = *(uint *)((long)*ptr_02 + uVar19 * 4), uVar56 = uVar57,
                           iVar21 = iVar11, iVar52 = iVar18, (int)uVar57 <= (int)uVar54)) {
                          if (iVar20 <= iVar18) {
                            iVar18 = iVar20;
                          }
                          uVar56 = uVar54;
                          iVar21 = local_e0;
                          iVar52 = iVar20;
                          if (local_e0 == iVar11 && uVar57 == uVar54) {
                            iVar52 = iVar18;
                          }
                        }
                        iVar20 = iVar52;
                        local_e0 = iVar21;
                        uVar54 = uVar56;
                        uVar19 = uVar19 + 1;
                      } while ((uVar29 & 0x1fffffff) << 2 != (int)uVar19);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      s1_end = uVar15 * 0x10;
                      uVar19 = ptr_02[uVar15][0];
                      uVar42 = ptr_02[uVar15][1];
                      if (iVar9 < 3) {
                        s1_end = 1;
                        if (1 < iVar16) {
                          s1_end = iVar16;
                        }
                        do {
                          uVar42 = uVar42 << 0x20 | uVar19 >> 0x20;
                          s1_end = s1_end + -1;
                          uVar19 = uVar19 << 0x20;
                        } while (s1_end != 0);
                      }
                      uVar54 = (uint)(uVar42 >> 0x20);
                      local_e0 = iVar11;
                      iVar20 = iVar8;
                    }
                    auVar34._0_4_ = -(uint)((int)uVar38 < (int)uVar27);
                    auVar34._4_4_ = -(uint)((int)uVar39 < (int)uVar27);
                    auVar34._8_4_ = -(uint)((int)uVar40 < (int)uVar27);
                    auVar34._12_4_ = -(uint)((int)uVar41 < (int)uVar27);
                    auVar37._0_4_ = -(uint)((int)uVar10 < (int)auVar35._0_4_);
                    auVar37._4_4_ = -(uint)((int)uVar10 < (int)auVar35._4_4_);
                    auVar37._8_4_ = -(uint)((int)uVar10 < (int)auVar35._8_4_);
                    auVar37._12_4_ = -(uint)((int)uVar10 < (int)auVar35._12_4_);
                    iVar8 = movmskps(s1_end,auVar37 | auVar34);
                    if (iVar8 != 0) {
                      *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                      uVar54 = 0;
                      local_e0 = 0;
                      iVar20 = 0;
                    }
                    ppVar12->score = uVar54;
                    ppVar12->end_query = iVar20;
                    ppVar12->end_ref = local_e0;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_02);
                    return ppVar12;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}